

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getChrmMatrixXY
               (float *m,float wx,float wy,float rx,float ry,float gx,float gy,float bx,float by)

{
  float in_EDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float bZ;
  float bY;
  float bX;
  float gZ;
  float gY;
  float gX;
  float rZ;
  float rY;
  float rX;
  float wZ;
  float wY;
  float wX;
  float in_stack_fffffffffffffff8;
  uint local_4;
  
  if (((((in_XMM1_Da == 0.0) && (!NAN(in_XMM1_Da))) || ((in_XMM3_Da == 0.0 && (!NAN(in_XMM3_Da)))))
      || ((in_XMM5_Da == 0.0 && (!NAN(in_XMM5_Da))))) || ((in_XMM7_Da == 0.0 && (!NAN(in_XMM7_Da))))
     ) {
    local_4 = 1;
  }
  else {
    local_4 = getChrmMatrixXYZ((float *)CONCAT44(in_XMM0_Da / in_XMM1_Da,0x3f800000),
                               ((1.0 - in_XMM0_Da) - in_XMM1_Da) / in_XMM1_Da,
                               in_XMM2_Da / in_XMM3_Da,1.0,
                               ((1.0 - in_XMM2_Da) - in_XMM3_Da) / in_XMM3_Da,
                               in_XMM4_Da / in_XMM5_Da,1.0,
                               ((1.0 - in_XMM4_Da) - in_XMM5_Da) / in_XMM5_Da,
                               in_XMM6_Da / in_XMM7_Da,in_XMM3_Da,in_XMM1_Da,in_EDI,
                               in_stack_fffffffffffffff8);
  }
  return local_4;
}

Assistant:

static unsigned getChrmMatrixXY(float* m,
                                float wx, float wy,
                                float rx, float ry,
                                float gx, float gy,
                                float bx, float by) {
  if(wy == 0 || ry == 0 || gy == 0 || by == 0) {
    return 1; /* error, division through zero */
  } else {
    float wX = wx / wy, wY = 1, wZ = (1 - wx - wy) / wy;
    float rX = rx / ry, rY = 1, rZ = (1 - rx - ry) / ry;
    float gX = gx / gy, gY = 1, gZ = (1 - gx - gy) / gy;
    float bX = bx / by, bY = 1, bZ = (1 - bx - by) / by;
    return getChrmMatrixXYZ(m, wX, wY, wZ, rX, rY, rZ, gX, gY, gZ, bX, bY, bZ);
  }
}